

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Subpackage * __thiscall
google::protobuf::DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
          (Tables *this)

{
  int *piVar1;
  int *sizep;
  int *local_20;
  
  piVar1 = (int *)operator_new(0x18);
  local_20 = piVar1;
  std::
  vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
  ::emplace_back<int*&>
            ((vector<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>,std::allocator<std::unique_ptr<int,google::protobuf::DescriptorPool::Tables::MiscDeleter>>>
              *)&this->misc_allocs_,&local_20);
  *local_20 = 0x10;
  *(undefined1 *)(piVar1 + 2) = 0;
  piVar1[3] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  return (Subpackage *)(piVar1 + 2);
}

Assistant:

Type* DescriptorPool::Tables::Allocate() {
  static_assert(std::is_trivially_destructible<Type>::value, "");
  static_assert(alignof(Type) <= 8, "");
  return ::new (AllocateBytes(sizeof(Type))) Type{};
}